

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# create_torrent.cpp
# Opt level: O3

void libtorrent::set_piece_hashes
               (create_torrent *t,string *p,settings_pack *sett,
               function<void_(libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>)>
               *f,error_code *ec)

{
  disk_io_constructor_type local_28;
  
  local_28.super__Function_base._M_functor._8_8_ = 0;
  local_28.super__Function_base._M_functor._M_unused._M_function_pointer =
       default_disk_io_constructor;
  local_28._M_invoker =
       ::std::
       _Function_handler<std::unique_ptr<libtorrent::disk_interface,_std::default_delete<libtorrent::disk_interface>_>_(boost::asio::io_context_&,_const_libtorrent::settings_interface_&,_libtorrent::counters_&),_std::unique_ptr<libtorrent::disk_interface,_std::default_delete<libtorrent::disk_interface>_>_(*)(boost::asio::io_context_&,_const_libtorrent::settings_interface_&,_libtorrent::counters_&)>
       ::_M_invoke;
  local_28.super__Function_base._M_manager =
       ::std::
       _Function_handler<std::unique_ptr<libtorrent::disk_interface,_std::default_delete<libtorrent::disk_interface>_>_(boost::asio::io_context_&,_const_libtorrent::settings_interface_&,_libtorrent::counters_&),_std::unique_ptr<libtorrent::disk_interface,_std::default_delete<libtorrent::disk_interface>_>_(*)(boost::asio::io_context_&,_const_libtorrent::settings_interface_&,_libtorrent::counters_&)>
       ::_M_manager;
  set_piece_hashes(t,p,sett,&local_28,f,ec);
  if (local_28.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_28.super__Function_base._M_manager)
              ((_Any_data *)&local_28,(_Any_data *)&local_28,__destroy_functor);
  }
  return;
}

Assistant:

void set_piece_hashes(create_torrent& t, std::string const& p
		, settings_pack const& sett
		, std::function<void(piece_index_t)> const& f, error_code& ec)
	{
		set_piece_hashes(t, p, sett, default_disk_io_constructor, f, ec);
	}